

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int read_attribute(dwarf_form form,uint64_t implicit_val,dwarf_buf *buf,int is_dwarf64,int version,
                  int addrsize,dwarf_sections *dwarf_sections,dwarf_data *altlink,attr_val *val)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uchar *puVar8;
  size_t count;
  char *pcVar9;
  
  uVar6 = (ulong)form;
LAB_00128c19:
  *(undefined8 *)val = 0;
  (val->u).uint = 0;
  iVar4 = (int)uVar6;
  switch(iVar4) {
  case 1:
    val->encoding = ATTR_VAL_ADDRESS;
    goto LAB_00128f6e;
  case 2:
switchD_00128c2b_caseD_2:
    dwarf_buf_error(buf,"unrecognized DWARF form",-1);
    return 0;
  case 3:
    val->encoding = ATTR_VAL_BLOCK;
    uVar2 = read_uint16(buf);
    count = (size_t)uVar2;
    break;
  case 4:
    val->encoding = ATTR_VAL_BLOCK;
    uVar3 = read_uint32(buf);
    count = (size_t)uVar3;
    break;
  case 5:
    val->encoding = ATTR_VAL_UINT;
    goto LAB_00128e8b;
  case 6:
    val->encoding = ATTR_VAL_UINT;
    goto LAB_00128d4c;
  case 7:
    val->encoding = ATTR_VAL_UINT;
    goto LAB_00128f92;
  case 8:
    val->encoding = ATTR_VAL_STRING;
    pcVar9 = read_string(buf);
    (val->u).string = pcVar9;
    return (uint)(pcVar9 != (char *)0x0);
  case 9:
    val->encoding = ATTR_VAL_BLOCK;
    goto LAB_00128e4e;
  case 10:
    val->encoding = ATTR_VAL_BLOCK;
    bVar1 = read_byte(buf);
    count = (size_t)bVar1;
    break;
  case 0xb:
  case 0xc:
    val->encoding = ATTR_VAL_UINT;
    goto LAB_00128f42;
  case 0xd:
    val->encoding = ATTR_VAL_SINT;
    puVar8 = (uchar *)read_sleb128(buf);
    goto LAB_00129043;
  case 0xe:
    uVar7 = read_offset(buf,is_dwarf64);
    if (uVar7 < dwarf_sections->size[4]) {
      val->encoding = ATTR_VAL_STRING;
      puVar8 = dwarf_sections->data[4] + uVar7;
      goto LAB_00128f0e;
    }
    pcVar9 = "DW_FORM_strp out of range";
    goto LAB_00129032;
  case 0xf:
    val->encoding = ATTR_VAL_UINT;
    goto LAB_00128fa8;
  case 0x10:
    val->encoding = ATTR_VAL_REF_INFO;
    if (version != 2) goto LAB_0012903e;
LAB_00128f6e:
    puVar8 = (uchar *)read_address(buf,addrsize);
    goto LAB_00129043;
  case 0x11:
    val->encoding = ATTR_VAL_REF_UNIT;
LAB_00128f42:
    bVar1 = read_byte(buf);
    puVar8 = (uchar *)(ulong)bVar1;
    goto LAB_00129043;
  case 0x12:
    val->encoding = ATTR_VAL_REF_UNIT;
LAB_00128e8b:
    uVar2 = read_uint16(buf);
    puVar8 = (uchar *)(ulong)uVar2;
    goto LAB_00129043;
  case 0x13:
    val->encoding = ATTR_VAL_REF_UNIT;
    goto LAB_00128d4c;
  case 0x14:
    val->encoding = ATTR_VAL_REF_UNIT;
    goto LAB_00128f92;
  case 0x15:
    val->encoding = ATTR_VAL_REF_UNIT;
    goto LAB_00128fa8;
  case 0x16:
    goto switchD_00128c2b_caseD_16;
  case 0x17:
    val->encoding = ATTR_VAL_REF_SECTION;
LAB_0012903e:
    puVar8 = (uchar *)read_offset(buf,is_dwarf64);
    goto LAB_00129043;
  case 0x18:
    val->encoding = ATTR_VAL_EXPR;
LAB_00128e4e:
    count = read_uleb128(buf);
    break;
  case 0x19:
    val->encoding = ATTR_VAL_UINT;
    (val->u).uint = 1;
    return 1;
  case 0x1a:
    puVar8 = (uchar *)read_uleb128(buf);
    goto LAB_00128fe2;
  case 0x1b:
    puVar8 = (uchar *)read_uleb128(buf);
    goto LAB_00128f31;
  case 0x1c:
    val->encoding = ATTR_VAL_REF_SECTION;
LAB_00128d4c:
    uVar3 = read_uint32(buf);
    puVar8 = (uchar *)(ulong)uVar3;
    goto LAB_00129043;
  case 0x1d:
    goto switchD_00128c2b_caseD_1d;
  case 0x1e:
    val->encoding = ATTR_VAL_BLOCK;
    count = 0x10;
    break;
  case 0x1f:
    uVar7 = read_offset(buf,is_dwarf64);
    if (uVar7 < dwarf_sections->size[7]) {
      val->encoding = ATTR_VAL_STRING;
      puVar8 = dwarf_sections->data[7] + uVar7;
LAB_00128f0e:
      (val->u).string = (char *)puVar8;
      return 1;
    }
    pcVar9 = "DW_FORM_line_strp out of range";
    goto LAB_00129032;
  case 0x20:
    val->encoding = ATTR_VAL_REF_TYPE;
    goto LAB_00128f92;
  case 0x21:
    val->encoding = ATTR_VAL_UINT;
    (val->u).uint = implicit_val;
    return 1;
  case 0x22:
switchD_00128c2b_caseD_22:
    val->encoding = ATTR_VAL_REF_SECTION;
    goto LAB_00128fa8;
  case 0x23:
    val->encoding = ATTR_VAL_RNGLISTS_INDEX;
LAB_00128fa8:
    puVar8 = (uchar *)read_uleb128(buf);
    goto LAB_00129043;
  case 0x24:
    val->encoding = ATTR_VAL_REF_SECTION;
LAB_00128f92:
    puVar8 = (uchar *)read_uint64(buf);
LAB_00129043:
    (val->u).string = (char *)puVar8;
    return 1;
  case 0x25:
    bVar1 = read_byte(buf);
    puVar8 = (uchar *)(ulong)bVar1;
    goto LAB_00128fe2;
  case 0x26:
    uVar2 = read_uint16(buf);
    puVar8 = (uchar *)(ulong)uVar2;
    goto LAB_00128fe2;
  case 0x27:
    uVar5 = read_uint24(buf);
    goto LAB_00128cfe;
  case 0x28:
    uVar5 = read_uint32(buf);
LAB_00128cfe:
    puVar8 = (uchar *)(ulong)uVar5;
LAB_00128fe2:
    val->encoding = ATTR_VAL_STRING_INDEX;
    goto LAB_00129043;
  case 0x29:
    bVar1 = read_byte(buf);
    puVar8 = (uchar *)(ulong)bVar1;
    goto LAB_00128f31;
  case 0x2a:
    uVar2 = read_uint16(buf);
    puVar8 = (uchar *)(ulong)uVar2;
    goto LAB_00128f31;
  case 0x2b:
    uVar5 = read_uint24(buf);
    goto LAB_00128f22;
  case 0x2c:
    uVar5 = read_uint32(buf);
LAB_00128f22:
    puVar8 = (uchar *)(ulong)uVar5;
LAB_00128f31:
    val->encoding = ATTR_VAL_ADDRESS_INDEX;
    goto LAB_00129043;
  default:
    if ((iVar4 == 0x1f01) || (iVar4 == 0x1f02)) goto switchD_00128c2b_caseD_22;
    if (iVar4 == 0x1f20) {
      uVar7 = read_offset(buf,is_dwarf64);
      (val->u).uint = uVar7;
      if (altlink != (dwarf_data *)0x0) {
        val->encoding = ATTR_VAL_REF_ALT_INFO;
        return 1;
      }
      val->encoding = ATTR_VAL_NONE;
      return 1;
    }
    if (iVar4 != 0x1f21) goto switchD_00128c2b_caseD_2;
switchD_00128c2b_caseD_1d:
    uVar7 = read_offset(buf,is_dwarf64);
    if (altlink == (dwarf_data *)0x0) {
      val->encoding = ATTR_VAL_NONE;
      return 1;
    }
    if (uVar7 < (altlink->dwarf_sections).size[4]) {
      val->encoding = ATTR_VAL_STRING;
      puVar8 = (altlink->dwarf_sections).data[4] + uVar7;
      goto LAB_00129043;
    }
    pcVar9 = "DW_FORM_strp_sup out of range";
    goto LAB_00129032;
  }
  iVar4 = advance(buf,count);
  return iVar4;
switchD_00128c2b_caseD_16:
  uVar6 = read_uleb128(buf);
  implicit_val = 0;
  if (uVar6 == 0x21) {
    pcVar9 = "DW_FORM_indirect to DW_FORM_implicit_const";
LAB_00129032:
    dwarf_buf_error(buf,pcVar9,0);
    return 0;
  }
  goto LAB_00128c19;
}

Assistant:

static int
read_attribute (enum dwarf_form form, uint64_t implicit_val,
		struct dwarf_buf *buf, int is_dwarf64, int version,
		int addrsize, const struct dwarf_sections *dwarf_sections,
		struct dwarf_data *altlink, struct attr_val *val)
{
  /* Avoid warnings about val.u.FIELD may be used uninitialized if
     this function is inlined.  The warnings aren't valid but can
     occur because the different fields are set and used
     conditionally.  */
  memset (val, 0, sizeof *val);

  switch (form)
    {
    case DW_FORM_addr:
      val->encoding = ATTR_VAL_ADDRESS;
      val->u.uint = read_address (buf, addrsize);
      return 1;
    case DW_FORM_block2:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint16 (buf));
    case DW_FORM_block4:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint32 (buf));
    case DW_FORM_data2:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_data4:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_data8:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_data16:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, 16);
    case DW_FORM_string:
      val->encoding = ATTR_VAL_STRING;
      val->u.string = read_string (buf);
      return val->u.string == NULL ? 0 : 1;
    case DW_FORM_block:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_block1:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_byte (buf));
    case DW_FORM_data1:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_flag:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_sdata:
      val->encoding = ATTR_VAL_SINT;
      val->u.sint = read_sleb128 (buf);
      return 1;
    case DW_FORM_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_STR] + offset;
	return 1;
      }
    case DW_FORM_line_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_LINE_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_line_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_LINE_STR] + offset;
	return 1;
      }
    case DW_FORM_udata:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_ref_addr:
      val->encoding = ATTR_VAL_REF_INFO;
      if (version == 2)
	val->u.uint = read_address (buf, addrsize);
      else
	val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_ref1:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_ref2:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_ref4:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref8:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_ref_udata:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_indirect:
      {
	uint64_t form;

	form = read_uleb128 (buf);
	if (form == DW_FORM_implicit_const)
	  {
	    dwarf_buf_error (buf,
			     "DW_FORM_indirect to DW_FORM_implicit_const",
			     0);
	    return 0;
	  }
	return read_attribute ((enum dwarf_form) form, 0, buf, is_dwarf64,
			       version, addrsize, dwarf_sections, altlink,
			       val);
      }
    case DW_FORM_sec_offset:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_exprloc:
      val->encoding = ATTR_VAL_EXPR;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_flag_present:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = 1;
      return 1;
    case DW_FORM_ref_sig8:
      val->encoding = ATTR_VAL_REF_TYPE;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_strx: case DW_FORM_strx1: case DW_FORM_strx2:
    case DW_FORM_strx3: case DW_FORM_strx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_strx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_strx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_strx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_strx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_strx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_addrx: case DW_FORM_addrx1: case DW_FORM_addrx2:
    case DW_FORM_addrx3: case DW_FORM_addrx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_addrx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_addrx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_addrx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_addrx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_addrx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_ADDRESS_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_ref_sup4:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref_sup8:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_implicit_const:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = implicit_val;
      return 1;
    case DW_FORM_loclistx:
      /* We don't distinguish this from DW_FORM_sec_offset.  It
       * shouldn't matter since we don't care about loclists.  */
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_rnglistx:
      val->encoding = ATTR_VAL_RNGLISTS_INDEX;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_addr_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_str_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_ref_alt:
      val->u.uint = read_offset (buf, is_dwarf64);
      if (altlink == NULL)
	{
	  val->encoding = ATTR_VAL_NONE;
	  return 1;
	}
      val->encoding = ATTR_VAL_REF_ALT_INFO;
      return 1;
    case DW_FORM_strp_sup: case DW_FORM_GNU_strp_alt:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (altlink == NULL)
	  {
	    val->encoding = ATTR_VAL_NONE;
	    return 1;
	  }
	if (offset >= altlink->dwarf_sections.size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp_sup out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) altlink->dwarf_sections.data[DEBUG_STR] + offset;
	return 1;
      }
    default:
      dwarf_buf_error (buf, "unrecognized DWARF form", -1);
      return 0;
    }
}